

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenize.cpp
# Opt level: O0

void skiwi::anon_unknown_4::_treat_buffer
               (string *buff,vector<skiwi::token,_std::allocator<skiwi::token>_> *tokens,int line_nr
               ,int column_nr,bool *is_a_symbol)

{
  int iVar1;
  vector<skiwi::token,std::allocator<skiwi::token>> *pvVar2;
  vector<skiwi::token,_std::allocator<skiwi::token>_> *__args_1;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  char *pcVar6;
  int local_ac [3];
  e_type local_a0;
  int local_9c [3];
  int local_90;
  int is_scientific;
  int is_real;
  e_type local_68 [5];
  int local_54;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  e_type local_30 [2];
  bool *local_28;
  bool *is_a_symbol_local;
  int column_nr_local;
  int line_nr_local;
  vector<skiwi::token,_std::allocator<skiwi::token>_> *tokens_local;
  string *buff_local;
  
  local_28 = is_a_symbol;
  is_a_symbol_local._0_4_ = column_nr;
  is_a_symbol_local._4_4_ = line_nr;
  _column_nr_local = (vector<skiwi::token,std::allocator<skiwi::token>> *)tokens;
  tokens_local = (vector<skiwi::token,_std::allocator<skiwi::token>_> *)buff;
  if ((*is_a_symbol & 1U) == 0) {
    uVar5 = std::__cxx11::string::empty();
    if (((uVar5 & 1) == 0) &&
       (pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)tokens_local), *pcVar6 != '\0')) {
      pcVar6 = (char *)std::__cxx11::string::c_str();
      iVar4 = is_number(&local_90,local_9c + 2,pcVar6);
      __args_1 = tokens_local;
      pvVar2 = _column_nr_local;
      iVar1 = (int)is_a_symbol_local;
      if (iVar4 == 0) {
        local_ac[1] = 0xd;
        local_ac[0] = std::__cxx11::string::length();
        local_ac[0] = iVar1 - local_ac[0];
        std::vector<skiwi::token,std::allocator<skiwi::token>>::
        emplace_back<skiwi::token::e_type,std::__cxx11::string&,int&,int>
                  (pvVar2,(e_type *)(local_ac + 1),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__args_1,
                   (int *)((long)&is_a_symbol_local + 4),local_ac);
      }
      else if (local_90 == 0) {
        local_a0 = T_FIXNUM;
        local_ac[2] = std::__cxx11::string::length();
        local_ac[2] = iVar1 - local_ac[2];
        std::vector<skiwi::token,std::allocator<skiwi::token>>::
        emplace_back<skiwi::token::e_type,std::__cxx11::string&,int&,int>
                  (pvVar2,&local_a0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__args_1,
                   (int *)((long)&is_a_symbol_local + 4),local_ac + 2);
      }
      else {
        local_9c[1] = 10;
        local_9c[0] = std::__cxx11::string::length();
        local_9c[0] = iVar1 - local_9c[0];
        std::vector<skiwi::token,std::allocator<skiwi::token>>::
        emplace_back<skiwi::token::e_type,std::__cxx11::string&,int&,int>
                  (pvVar2,(e_type *)(local_9c + 1),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__args_1,
                   (int *)((long)&is_a_symbol_local + 4),local_9c);
      }
    }
  }
  else {
    *is_a_symbol = false;
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)tokens_local);
      pvVar2 = _column_nr_local;
      if (*pcVar6 == '#') {
        local_30[0] = T_ID;
        std::operator+(&local_50,"#",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       tokens_local);
        iVar1 = (int)is_a_symbol_local;
        local_54 = std::__cxx11::string::length();
        local_54 = iVar1 - local_54;
        std::vector<skiwi::token,std::allocator<skiwi::token>>::
        emplace_back<skiwi::token::e_type,std::__cxx11::string,int&,int>
                  (pvVar2,local_30,&local_50,(int *)((long)&is_a_symbol_local + 4),&local_54);
        std::__cxx11::string::~string((string *)&local_50);
      }
      else {
        local_68[0] = T_SYMBOL;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&is_real
                       ,"#",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            tokens_local);
        iVar1 = (int)is_a_symbol_local;
        uVar3 = std::__cxx11::string::length();
        is_scientific = ~uVar3 + iVar1;
        std::vector<skiwi::token,std::allocator<skiwi::token>>::
        emplace_back<skiwi::token::e_type,std::__cxx11::string,int&,int>
                  (pvVar2,local_68,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&is_real,
                   (int *)((long)&is_a_symbol_local + 4),&is_scientific);
        std::__cxx11::string::~string((string *)&is_real);
      }
    }
    else {
      local_30[1] = 0;
      std::vector<skiwi::token,std::allocator<skiwi::token>>::
      emplace_back<skiwi::token::e_type,std::__cxx11::string&,int&,int&>
                (_column_nr_local,local_30 + 1,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)tokens_local,
                 (int *)((long)&is_a_symbol_local + 4),(int *)&is_a_symbol_local);
    }
  }
  std::__cxx11::string::clear();
  return;
}

Assistant:

void _treat_buffer(std::string& buff, std::vector<token>& tokens, int line_nr, int column_nr, bool& is_a_symbol)
    {
    if (is_a_symbol)
      {
      is_a_symbol = false;
      if (buff.empty())
        tokens.emplace_back(token::T_BAD, buff, line_nr, column_nr);
      else
        {
        if (buff[0] == '#') // special case. some primitives (inlined ones) can start with two ##
          {
          tokens.emplace_back(token::T_ID, "#" + buff, line_nr, column_nr - (int)buff.length());
          }
        else
          tokens.emplace_back(token::T_SYMBOL, "#" + buff, line_nr, column_nr - (int)buff.length() - 1);
        }
      }
    else if (!buff.empty() && buff[0] != '\0')
      {
      int is_real;
      int is_scientific;
      if (is_number(&is_real, &is_scientific, buff.c_str()))
        {
        if (is_real)
          tokens.emplace_back(token::T_FLONUM, buff, line_nr, column_nr - (int)buff.length());
        else
          tokens.emplace_back(token::T_FIXNUM, buff, line_nr, column_nr - (int)buff.length());
        }
      else
        {
        tokens.emplace_back(token::T_ID, buff, line_nr, column_nr - (int)buff.length());
        }
      }
    buff.clear();
    }